

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacintoshIMG.cpp
# Opt level: O2

void __thiscall
Storage::Disk::MacintoshIMG::MacintoshIMG
          (MacintoshIMG *this,string *file_name,FixedType type,size_t offset,size_t length)

{
  undefined4 *puVar1;
  
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__MacintoshIMG_0058e800;
  FileHolder::FileHolder(&this->file_,file_name,ReadWrite);
  (this->tags_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tags_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tags_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->is_diskCopy_file_ = false;
  (this->buffer_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->buffer_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->buffer_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->buffer_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->buffer_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->raw_offset_ = 0;
  if (type == GCR) {
    construct_raw_gcr(this,offset,length);
    return;
  }
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 0xfffffffe;
  __cxa_throw(puVar1,&Error::typeinfo,0);
}

Assistant:

MacintoshIMG::MacintoshIMG(const std::string &file_name, FixedType type, size_t offset, size_t length) :
	file_(file_name) {

	switch(type) {
		case FixedType::GCR:
			construct_raw_gcr(offset, length);
		break;
		default:
			throw Error::InvalidFormat;
	}
}